

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererParallelTests::RendererPopulatesBitmapWithMaskDataAccordingToWindow
          (RendererParallelTests *this)

{
  allocator local_209;
  blender<unsigned_char,_unsigned_char> blender1;
  uint8_t reference1 [44];
  bitmap<unsigned_char,_0UL,_0UL> bitmap1;
  string local_198;
  LocationInfo local_178;
  mask_full<8UL> mask1;
  cell cells4 [2];
  undefined1 local_110 [8];
  cell cells3 [2];
  undefined1 local_f0 [8];
  renderer_parallel r;
  rect_i window1;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  cell local_84;
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  cell local_54;
  scanline_cells cells [4];
  
  cells[0].second = &local_54;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_68 = 0;
  uStack_5c = 0;
  local_78._8_8_ = 0x300000011;
  uStack_64 = 0xfffffffd;
  uStack_60 = 7;
  local_58 = 0xfffffff2;
  cells[1].second = &local_84;
  local_98 = 0;
  uStack_8c = 0;
  local_a8._0_4_ = 6;
  local_a8._4_4_ = 0;
  local_a8._8_8_ = 0x9000000ab;
  uStack_94 = 0xffffffe2;
  uStack_90 = 10;
  local_88 = 0xffffff73;
  cells[2].second = (cell *)local_f0;
  cells3[0].x = 1;
  cells3[0].area = 0;
  cells3[0].cover = 0xa0;
  cells3[1].x = 9;
  cells3[1].area = 0;
  cells3[1].cover = -0xa0;
  cells[3].second = (cell *)local_110;
  cells4[1].area = 0;
  cells4[1].cover = -0x10;
  cells4[0].x = 1;
  cells4[0].area = 0;
  cells4[0].cover = 0x10;
  cells4[1].x = 9;
  cells[0].first = (cell *)local_78;
  cells[1].first = (cell *)local_a8;
  cells[2].first = cells3;
  cells[3].first = cells4;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask<8ul> *)&mask1,&cells,3);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&bitmap1,0xb,4);
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderer_parallel::renderer_parallel(&r,2);
  window1.x1 = 5;
  window1.y1 = 3;
  window1.x2 = 7;
  window1.y2 = 6;
  renderer_parallel::operator()
            (&r,&bitmap1,(vector_i)0x3ffffffff,&window1,&mask1,&blender1,
             (simple_alpha<unsigned_char,_8UL> *)reference1);
  reference1[8] = '\0';
  reference1[9] = '\0';
  reference1[10] = '\0';
  reference1[0xb] = '\0';
  reference1[0xc] = '\0';
  reference1[0xd] = '\0';
  reference1[0xe] = '\0';
  reference1[0xf] = '\0';
  reference1[0x18] = '\0';
  reference1[0x19] = '\0';
  reference1[0x1a] = '\0';
  reference1[0x1b] = '\0';
  reference1[0x1e] = '\0';
  reference1[0x1f] = '\0';
  reference1[0x20] = '\0';
  reference1[0x21] = '\0';
  reference1[0x22] = '\0';
  reference1[0x23] = '\0';
  reference1[0x24] = '\0';
  reference1[0x25] = '\0';
  reference1[0x26] = '\0';
  reference1[0x27] = '\0';
  reference1[0x28] = '\0';
  reference1[0x29] = '\0';
  reference1[0x2a] = '\0';
  reference1[0x2b] = '\0';
  reference1[0] = '\0';
  reference1[1] = '\0';
  reference1[2] = '\0';
  reference1[3] = '\0';
  reference1[4] = '\0';
  reference1[5] = '\0';
  reference1[6] = '\x0e';
  reference1[7] = '\x0e';
  reference1[0x10] = '\0';
  reference1[0x11] = '\0';
  reference1[0x12] = 0xab;
  reference1[0x13] = '\0';
  reference1[0x14] = '\0';
  reference1[0x15] = '\0';
  reference1[0x16] = '\0';
  reference1[0x17] = '\0';
  reference1[0x1c] = 0xa0;
  reference1[0x1d] = 0xa0;
  std::__cxx11::string::string
            ((string *)&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_209);
  ut::LocationInfo::LocationInfo(&local_178,&local_198,0xd5);
  ut::are_equal<unsigned_char,44ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&reference1,&bitmap1.data,&local_178);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  renderer_parallel::~renderer_parallel(&r);
  std::
  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                   *)&blender1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitmap1);
  std::
  _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::~_Vector_base(&mask1.super_mask<8UL>._cells.
                   super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 );
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordingToWindow )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 3, 0, -0x03 }, { 7, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 6, 0, 0xAB }, { 9, 0, -0x1E }, { 10, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 9, 0, -0x10 }, };
				const mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
				};
				const mocks::mask_full<8> mask1(cells, 3);
				mocks::bitmap<uint8_t> bitmap1(11, 4);
				mocks::blender<uint8_t, uint8_t> blender1;

				renderer_parallel r(2);

				// ACT
				const rect_i window1 = { 5, 3, 7, 6 };
				r(bitmap1, mkvector(-1, 3), &window1, mask1, blender1, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x0E, 0x0E, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap1.data);
			}